

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate.c
# Opt level: O0

void * dsGetIndex(void)

{
  dsCrate *crate_00;
  void *ptr;
  dsCrate *crate;
  
  crate_00 = getActiveCrate();
  if (crate_00 == (dsCrate *)0x0) {
    dsRunLogCallback("%s(): Can\'t get active crate.\n","dsGetIndex");
    crate = (dsCrate *)0xffffffffffffffff;
  }
  else {
    crate = (dsCrate *)
            mapObject(crate_00,crate_00->super->indexObjectOffset,crate_00->super->indexObjectLength
                     );
    if (crate == (dsCrate *)0x0) {
      dsRunLogCallback("%s(): Can\'t mapObject(,%lu,%lu)\n","dsGetIndex",
                       crate_00->super->indexObjectOffset,crate_00->super->indexObjectLength);
      crate = (dsCrate *)0xffffffffffffffff;
    }
  }
  return crate;
}

Assistant:

void *
dsGetIndex()
{
	dsCrate *crate = NULL;
	void *ptr;

	if ((crate = getActiveCrate()) == NULL) {
		dsLog("Can't get active crate.\n");
		return (void *)-1;
	}

	if ((ptr = mapObject(crate, crate->super->indexObjectOffset,
					crate->super->indexObjectLength)) == NULL) {
		dsLog("Can't mapObject(,%" PRIu64 ",%" PRIu64 ")\n",
			crate->super->indexObjectOffset,
			crate->super->indexObjectLength);
		return (void *)-1;
	}

	return ptr;
}